

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_sconn_rxdone(void *arg)

{
  nni_http_server *sc_00;
  _Bool _Var1;
  nng_http_status nVar2;
  int iVar3;
  nng_err nVar4;
  char *pcVar5;
  ulonglong uVar6;
  nni_http_res *res;
  undefined1 local_90 [8];
  nng_iov iov;
  size_t len;
  char *end;
  char *cls;
  char *host;
  _Bool needhost;
  char *pcStack_58;
  _Bool badmeth;
  char *uri;
  nni_http_req *req;
  char *val;
  nni_http_handler *head;
  nni_http_handler *h;
  nni_aio *pnStack_28;
  int rv;
  nni_aio *aio;
  nni_http_server *s;
  http_sconn *sc;
  void *arg_local;
  
  aio = *(nni_aio **)((long)arg + 0x18);
  pnStack_28 = (nni_aio *)((long)arg + 0x210);
  head = (nni_http_handler *)0x0;
  val = (char *)0x0;
  s = (nni_http_server *)arg;
  sc = (http_sconn *)arg;
  uri = (char *)nni_http_conn_req(*(nng_http **)((long)arg + 0x10));
  host._7_1_ = 0;
  host._6_1_ = 0;
  h._4_4_ = nni_aio_result(pnStack_28);
  if (h._4_4_ == NNG_OK) {
    if ((s->addr).s_storage.sa_pad[6] == 0) {
      head = (nni_http_handler *)(s->addr).s_storage.sa_pad[3];
      if (head == (nni_http_handler *)0x0) {
        nVar2 = nng_http_get_status((nng_http *)(s->addr).s_storage.sa_pad[1]);
        sc_00 = s;
        if (399 < nVar2) {
          nVar2 = nng_http_get_status((nng_http *)(s->addr).s_storage.sa_pad[1]);
          http_sconn_error((http_sconn *)sc_00,nVar2);
          return;
        }
        req = (nni_http_req *)nng_http_get_version((nng_http *)(s->addr).s_storage.sa_pad[1]);
        if (req == (nni_http_req *)0x0) {
          (s->addr).s_ipc.sa_path[0x2e] = '\x01';
          http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_BAD_REQUEST);
          return;
        }
        iVar3 = strncmp((char *)req,"HTTP/1.",7);
        if (iVar3 != 0) {
          (s->addr).s_ipc.sa_path[0x2e] = '\x01';
          http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP);
          return;
        }
        iVar3 = strcmp((char *)req,"HTTP/1.1");
        if (iVar3 == 0) {
          host._6_1_ = 1;
        }
        else {
          (s->addr).s_ipc.sa_path[0x2e] = '\x01';
        }
        pcStack_58 = nng_http_get_uri((nng_http *)(s->addr).s_storage.sa_pad[1]);
        if (*pcStack_58 != '/') {
          (s->addr).s_ipc.sa_path[0x2e] = '\x01';
          http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_BAD_REQUEST);
          return;
        }
        req = (nni_http_req *)
              nni_http_get_header((nng_http *)(s->addr).s_storage.sa_pad[1],"Connection");
        if ((req != (nni_http_req *)0x0) &&
           (pcVar5 = nni_strcasestr((char *)req,"close"), pcVar5 != (char *)0x0)) {
          (s->addr).s_ipc.sa_path[0x2e] = '\x01';
        }
        (s->addr).s_storage.sa_pad[6] = 0;
        end = nni_http_get_header((nng_http *)(s->addr).s_storage.sa_pad[1],"Content-Length");
        if (end != (char *)0x0) {
          uVar6 = strtoull(end,(char **)&len,10);
          (s->addr).s_storage.sa_pad[6] = uVar6;
          if ((len == 0) && (cRam0000000000000000 != '\0')) {
            (s->addr).s_storage.sa_pad[6] = 0;
            http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_BAD_REQUEST);
            return;
          }
        }
        cls = nni_http_get_header((nng_http *)(s->addr).s_storage.sa_pad[1],"Host");
        if ((cls == (char *)0x0) && ((host._6_1_ & 1) != 0)) {
          http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_BAD_REQUEST);
          return;
        }
        nni_mtx_lock((nni_mtx *)(aio->a_iov + 2));
        for (head = (nni_http_handler *)
                    nni_list_first((nni_list *)((long)&(aio->a_task).task_cv.cv + 0x28));
            head != (nni_http_handler *)0x0;
            head = (nni_http_handler *)
                   nni_list_next((nni_list *)((long)&(aio->a_task).task_cv.cv + 0x28),head)) {
          _Var1 = http_handler_host_match(head,cls);
          if (_Var1) {
            iov.iov_len = strlen(head->uri);
            iVar3 = strncmp(pcStack_58,head->uri,iov.iov_len);
            if ((iVar3 == 0) &&
               ((pcStack_58[iov.iov_len] == '\0' ||
                ((pcStack_58[iov.iov_len] == '/' &&
                 ((pcStack_58[iov.iov_len + 1] == '\0' || ((head->tree & 1U) != 0)))))))) {
              if (head->method[0] == '\0') break;
              req = (nni_http_req *)nni_http_get_method((nng_http *)(s->addr).s_storage.sa_pad[1]);
              iVar3 = strcmp((char *)req,head->method);
              if (iVar3 == 0) break;
              iVar3 = strcmp((char *)req,"HEAD");
              if ((iVar3 == 0) && (iVar3 = strcmp(head->method,"GET"), iVar3 == 0)) {
                val = (char *)head;
              }
              else {
                host._7_1_ = 1;
              }
            }
          }
        }
        if ((head == (nni_http_handler *)0x0) && (val != (char *)0x0)) {
          head = (nni_http_handler *)val;
        }
        if (head == (nni_http_handler *)0x0) {
          nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
          if ((host._7_1_ & 1) != 0) {
            http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_METHOD_NOT_ALLOWED);
            return;
          }
          http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_NOT_FOUND);
          return;
        }
        if (((head->getbody & 1U) != 0) && ((s->addr).s_storage.sa_pad[6] != 0)) {
          if (head->maxbody < (s->addr).s_storage.sa_pad[6]) {
            nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
            http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_CONTENT_TOO_LARGE);
            return;
          }
          nVar4 = nni_http_req_alloc_data((nni_http_req *)uri,(s->addr).s_storage.sa_pad[6]);
          if (nVar4 != NNG_OK) {
            nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
            http_sconn_error((http_sconn *)s,NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR);
            return;
          }
          local_90 = *(undefined1 (*) [8])uri;
          iov.iov_buf = *(void **)(uri + 8);
          (s->addr).s_storage.sa_pad[6] = 0;
          (s->addr).s_storage.sa_pad[3] = (uint64_t)head;
          nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
          nni_aio_set_iov((nni_aio *)((s->accaio).a_iov + 6),1,(nni_iov *)local_90);
          nni_http_read_full((nni_http_conn *)(s->addr).s_storage.sa_pad[1],pnStack_28);
          return;
        }
      }
      else {
        nni_mtx_lock((nni_mtx *)(aio->a_iov + 2));
      }
      (s->addr).s_storage.sa_pad[4] = (uint64_t)head;
      (s->addr).s_storage.sa_pad[3] = 0;
      nni_atomic_inc(&head->ref);
      nni_aio_reset((nni_aio *)((long)&s->addr + 0x48));
      nni_mtx_unlock((nni_mtx *)(aio->a_iov + 2));
      res = nni_http_conn_res((nng_http *)(s->addr).s_storage.sa_pad[1]);
      nni_http_res_reset(res);
      nni_http_set_version((nng_http *)(s->addr).s_storage.sa_pad[1],"HTTP/1.1");
      nni_http_set_status((nng_http *)(s->addr).s_storage.sa_pad[1],0,(char *)0x0);
      (*head->cb)((nng_http *)(s->addr).s_storage.sa_pad[1],head->data,
                  (nng_aio *)((long)&s->addr + 0x48));
    }
    else {
      (s->addr).s_storage.sa_pad[6] = 0;
      nni_http_read_req((nni_http_conn *)(s->addr).s_storage.sa_pad[1],pnStack_28);
    }
  }
  else {
    http_sconn_close((http_sconn *)s);
  }
  return;
}

Assistant:

static void
http_sconn_rxdone(void *arg)
{
	http_sconn       *sc  = arg;
	nni_http_server  *s   = sc->server;
	nni_aio          *aio = &sc->rxaio;
	int               rv;
	nni_http_handler *h    = NULL;
	nni_http_handler *head = NULL;
	const char       *val;
	nni_http_req     *req = nni_http_conn_req(sc->conn);
	const char       *uri;
	bool              badmeth  = false;
	bool              needhost = false;
	const char       *host;
	const char       *cls;

	if ((rv = nni_aio_result(aio)) != NNG_OK) {
		http_sconn_close(sc);
		return;
	}

	// read the body, keep going
	if (sc->unconsumed_body) {
		sc->unconsumed_body = 0;
		nni_http_read_req(sc->conn, aio);
		return;
	}

	if ((h = sc->handler) != NULL) {
		nni_mtx_lock(&s->mtx);
		goto finish;
	}

	// Validate the request -- it has to at least look like HTTP
	// 1.x.  We flatly refuse to deal with HTTP 0.9, and we can't
	// cope with HTTP/2.
	if (nng_http_get_status(sc->conn) >= NNG_HTTP_STATUS_BAD_REQUEST) {
		http_sconn_error(sc, nng_http_get_status(sc->conn));
		return;
	}
	if ((val = nng_http_get_version(sc->conn)) == NULL) {
		sc->close = true;
		http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
		return;
	}
	if (strncmp(val, "HTTP/1.", 7) != 0) {
		sc->close = true;
		http_sconn_error(sc, NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP);
		return;
	}
	if (strcmp(val, "HTTP/1.1") != 0) {
		// We treat HTTP/1.0 connections as non-persistent.
		// No effort is made for non-standard "persistent" HTTP/1.0.
		sc->close = true;
	} else {
		needhost = true;
	}

	// NB: The URI will already have been canonified by the REQ parser
	uri = nng_http_get_uri(sc->conn);
	if (uri[0] != '/') {
		// We do not support authority form or asterisk form at present
		sc->close = true;
		http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
		return;
	}

	// If the connection was 1.0, or a connection: close was
	// requested, then mark this close on our end.
	if ((val = nni_http_get_header(sc->conn, "Connection")) != NULL) {
		// HTTP 1.1 says these have to be case insensitive
		if (nni_strcasestr(val, "close") != NULL) {
			// In theory this could falsely match some other weird
			// connection header with the substring close.  No such
			// values are defined, so anyone who does that gets
			// what they deserve. (Harmless actually, since it only
			// prevents persistent connections.)
			sc->close = true;
		}
	}

	sc->unconsumed_body = 0;
	if ((cls = nni_http_get_header(sc->conn, "Content-Length")) != NULL) {
		char *end;
		sc->unconsumed_body = strtoull(cls, &end, 10);
		if ((end == NULL) && (*end != '\0')) {
			sc->unconsumed_body = 0;
			http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
			return;
		}
	}

	host = nni_http_get_header(sc->conn, "Host");
	if ((host == NULL) && (needhost)) {
		// Per RFC 2616 14.23 we have to send 400 status here.
		http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
		return;
	}

	nni_mtx_lock(&s->mtx);
	NNI_LIST_FOREACH (&s->handlers, h) {
		size_t len;

		if (!http_handler_host_match(h, host)) {
			continue;
		}

		len = strlen(h->uri);
		if (strncmp(uri, h->uri, len) != 0) {
			continue;
		}
		switch (uri[len]) {
		case '\0':
			break;
		case '/':
			if ((uri[len + 1] != '\0') && (!h->tree)) {
				// Trailing component and not a directory.
				continue;
			}
			break;
		default:
			continue; // Some other substring, not matched.
		}

		if (h->method[0] == '\0') {
			// Handler wants to process *all* methods.
			break;
		}
		// So, what about the method?
		val = nni_http_get_method(sc->conn);
		if (strcmp(val, h->method) == 0) {
			break;
		}
		// HEAD is remapped to GET, but only if no HEAD specific
		// handler registered.
		if ((strcmp(val, "HEAD") == 0) &&
		    (strcmp(h->method, "GET") == 0)) {
			head = h;
			continue;
		}
		badmeth = 1;
	}

	if ((h == NULL) && (head != NULL)) {
		h = head;
	}
	if (h == NULL) {
		nni_mtx_unlock(&s->mtx);
		if (badmeth) {
			http_sconn_error(
			    sc, NNG_HTTP_STATUS_METHOD_NOT_ALLOWED);
		} else {
			http_sconn_error(sc, NNG_HTTP_STATUS_NOT_FOUND);
		}
		return;
	}

	if ((h->getbody) && (sc->unconsumed_body > 0)) {

		if (sc->unconsumed_body > h->maxbody) {
			nni_mtx_unlock(&s->mtx);
			http_sconn_error(
			    sc, NNG_HTTP_STATUS_CONTENT_TOO_LARGE);
			return;
		}
		nng_iov iov;
		if ((nni_http_req_alloc_data(req, sc->unconsumed_body)) != 0) {
			nni_mtx_unlock(&s->mtx);
			http_sconn_error(
			    sc, NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR);
			return;
		}
		iov.iov_buf         = req->data.data;
		iov.iov_len         = req->data.size;
		sc->unconsumed_body = 0;
		sc->handler         = h;
		nni_mtx_unlock(&s->mtx);
		nni_aio_set_iov(&sc->rxaio, 1, &iov);
		nni_http_read_full(sc->conn, aio);
		return;
	}

finish:
	sc->release = h;
	sc->handler = NULL;

	// Set a reference -- this because the callback may be running
	// asynchronously even after it gets removed from the server.
	nni_atomic_inc(&h->ref);

	nni_aio_reset(&sc->cbaio);

	nni_mtx_unlock(&s->mtx);

	// make sure the response is freshly initialized
	nni_http_res_reset(nni_http_conn_res(sc->conn));
	nni_http_set_version(sc->conn, NNG_HTTP_VERSION_1_1);
	nni_http_set_status(sc->conn, 0, NULL);

	h->cb(sc->conn, h->data, &sc->cbaio);
}